

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall
Memory::Recycler::ExplicitFreeInternalWrapper<(Memory::ObjectInfoBits)32>
          (Recycler *this,void *buffer,size_t size)

{
  code *pcVar1;
  bool bVar2;
  ConfigFlagsTable *pCVar3;
  size_t sVar4;
  undefined8 *in_FS_OFFSET;
  size_t allocSize;
  size_t size_local;
  void *buffer_local;
  Recycler *this_local;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x484,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x485,"(size > 0)","size > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pCVar3 = GetRecyclerFlagsTable(this);
  bVar2 = Js::Phases::IsEnabled(&pCVar3->Off,ExplicitFreePhase);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    sVar4 = GetAllocSize(this,size);
    bVar2 = HeapInfo::IsSmallObject(sVar4);
    if (bVar2) {
      sVar4 = HeapInfo::GetAlignedSizeNoCheck(sVar4);
      this_local._7_1_ =
           ExplicitFreeInternal<(Memory::ObjectInfoBits)32,SmallAllocationBlockAttributes>
                     (this,buffer,size,sVar4);
    }
    else {
      bVar2 = HeapInfo::IsMediumObject(sVar4);
      if (bVar2) {
        sVar4 = HeapInfo::GetMediumObjectAlignedSizeNoCheck(sVar4);
        this_local._7_1_ =
             ExplicitFreeInternal<(Memory::ObjectInfoBits)32,MediumAllocationBlockAttributes>
                       (this,buffer,size,sVar4);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Recycler::ExplicitFreeInternalWrapper(void* buffer, size_t size)
{
    Assert(buffer != nullptr);
    Assert(size > 0);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ExplicitFreePhase))
    {
        return false;
    }
#endif

    size_t allocSize = GetAllocSize(size);

    if (HeapInfo::IsSmallObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, SmallAllocationBlockAttributes>(buffer, size, HeapInfo::GetAlignedSizeNoCheck(allocSize));
    }

    if (HeapInfo::IsMediumObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, MediumAllocationBlockAttributes>(buffer, size, HeapInfo::GetMediumObjectAlignedSizeNoCheck(allocSize));
    }

    return false;
}